

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>::
ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>
                *this,int opcode)

{
  int *piVar1;
  Kind KVar2;
  CountExpr CVar3;
  int iVar4;
  ArgHandler *arg_handler;
  int iVar5;
  SymbolicArgHandler args_2;
  NumberOfArgHandler args_3;
  NumericArgHandler args;
  VarArgHandler args_1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>::NumericExprReader>
  args_4;
  
  KVar2 = OpCodeInfo::INFO[opcode].first_kind;
  switch(KVar2) {
  case IF:
    ReadLogicalExpr(this);
    ReadNumericExpr(this,false);
    goto LAB_0010810f;
  case PLTERM:
    iVar4 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt(this->reader_);
    if (iVar4 < 2) {
      BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x12cf1b);
    }
    iVar5 = 1;
    if (1 < iVar4) {
      iVar5 = iVar4;
    }
    while( true ) {
      ReadConstant(this);
      if (iVar5 + -1 == 0) break;
      ReadConstant(this);
      iVar5 = iVar5 + -1;
    }
    ReadReference(this);
    break;
  case CALL:
  case LAST_VARARG:
switchD_001080eb_caseD_29:
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x12cf43);
    break;
  case FIRST_ITERATED:
    iVar4 = ReadNumArgs(this,1);
    arg_handler = &args_1;
    goto LAB_00108207;
  case SUM:
    iVar4 = ReadNumArgs(this,3);
    arg_handler = &args;
    goto LAB_00108207;
  case LAST_ITERATED:
    iVar4 = ReadNumArgs(this,1);
    ReadNumericExpr(this,false);
    iVar4 = iVar4 + -1;
    arg_handler = &args_3;
LAB_00108207:
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::ArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter> *)
               this,iVar4,arg_handler);
    break;
  case NUMBEROF_SYM:
    iVar4 = ReadNumArgs(this,1);
    ReadSymbolicExpr(this);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter>::SymbolicExprReader,mp::NLHandler<mp::NullNLHandler<Expr>,Expr>::ArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,ExprCounter> *)
               this,iVar4 + -1,&args_2);
    break;
  case COUNT:
    CVar3 = ReadCountExpr(this);
    return CVar3;
  default:
    if (KVar2 == ADD) {
      KVar2 = OpCodeInfo::INFO[opcode].kind;
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_ExprCounter>::NumericExprReader>
      ::BinaryArgReader(&args_4,this);
      if (KVar2 != DIV) {
        return OTHER;
      }
      if (args_4.rhs == CONST) {
        return OTHER;
      }
      piVar1 = &this->handler_->num_divs;
      *piVar1 = *piVar1 + 1;
      return OTHER;
    }
    if (KVar2 != FIRST_UNARY) goto switchD_001080eb_caseD_29;
LAB_0010810f:
    ReadNumericExpr(this,false);
  }
  return OTHER;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::FIRST_UNARY:
    return handler_.OnUnary(kind, ReadNumericExpr());
  case expr::FIRST_BINARY: {
    BinaryArgReader<> args(*this);
    return handler_.OnBinary(kind, args.lhs, args.rhs);
  }
  case expr::IF: {
    LogicalExpr condition = ReadLogicalExpr();
    NumericExpr then_expr = ReadNumericExpr();
    NumericExpr else_expr = ReadNumericExpr();
    return handler_.OnIf(condition, then_expr, else_expr);
  }
  case expr::PLTERM: {
    // Read a piecewise-linear term.
    int num_slopes = reader_.ReadUInt();
    if (num_slopes <= 1)
      reader_.ReportError("too few slopes in piecewise-linear term");
    reader_.ReadTillEndOfLine();
    typename Handler::PLTermHandler pl_handler =
        handler_.BeginPLTerm(num_slopes - 1);
    for (int i = 0; i < num_slopes - 1; ++i) {
      pl_handler.AddSlope(ReadConstant());
      pl_handler.AddBreakpoint(ReadConstant());
    }
    pl_handler.AddSlope(ReadConstant());
    return handler_.EndPLTerm(pl_handler, ReadReference());
  }
  case expr::FIRST_VARARG: {
    // Read a vararg expression (min or max).
    int num_args = ReadNumArgs(1);
    typename Handler::VarArgHandler args = handler_.BeginVarArg(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndVarArg(args);
  }
  case expr::SUM: {
    int num_args = ReadNumArgs();
    typename Handler::NumericArgHandler args = handler_.BeginSum(num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndSum(args);
  }
  case expr::COUNT:
    return ReadCountExpr();
  case expr::NUMBEROF: {
    // Read a numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::NumberOfArgHandler args =
        handler_.BeginNumberOf(num_args, ReadNumericExpr());
    DoReadArgs<NumericExprReader>(num_args - 1, args);
    return handler_.EndNumberOf(args);
  }
  case expr::NUMBEROF_SYM: {
    // Read a symbolic numberof expression.
    int num_args = ReadNumArgs(1);
    reader_.ReadTillEndOfLine();
    typename Handler::SymbolicArgHandler args =
        handler_.BeginSymbolicNumberOf(num_args, ReadSymbolicExpr());
    DoReadArgs<SymbolicExprReader>(num_args - 1, args);
    return handler_.EndSymbolicNumberOf(args);
  }
  default:
    reader_.ReportError("expected numeric expression opcode");
  }
  return NumericExpr();
}